

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::javanano::IsOuterClassNeeded(Params *params,FileDescriptor *file)

{
  bool bVar1;
  int iVar2;
  string *file_name;
  FileDescriptor *file_local;
  Params *params_local;
  
  file_name = FileDescriptor::name_abi_cxx11_(file);
  bVar1 = Params::java_multiple_files(params,file_name);
  if (bVar1) {
    iVar2 = FileDescriptor::extension_count(file);
    if (iVar2 == 0) {
      iVar2 = FileDescriptor::enum_type_count(file);
      if ((iVar2 != 0) && (bVar1 = Params::java_enum_style(params), !bVar1)) {
        return true;
      }
      params_local._7_1_ = false;
    }
    else {
      params_local._7_1_ = true;
    }
  }
  else {
    params_local._7_1_ = true;
  }
  return params_local._7_1_;
}

Assistant:

bool IsOuterClassNeeded(const Params& params, const FileDescriptor* file) {
  // If java_multiple_files is false, the outer class is always needed.
  if (!params.java_multiple_files(file->name())) {
    return true;
  }

  // File-scope extensions need the outer class as the scope.
  if (file->extension_count() != 0) {
    return true;
  }

  // If container interfaces are not generated, file-scope enums need the
  // outer class as the scope.
  if (file->enum_type_count() != 0 && !params.java_enum_style()) {
    return true;
  }

  return false;
}